

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m256v_permute_cols(m256v *M,int *colperm)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint8_t *puVar6;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint8_t *__s;
  undefined8 uStack_30;
  uint8_t auStack_28 [8];
  ulong uVar7;
  
  uVar1 = M->n_col;
  lVar10 = -((ulong)uVar1 + 0xf & 0xfffffffffffffff0);
  __s = auStack_28 + lVar10;
  if (0 < (int)uVar1) {
    *(undefined8 *)((long)&uStack_30 + lVar10) = 0x102cec;
    memset(__s,0,(ulong)uVar1);
  }
  uVar1 = M->n_row;
  uVar3 = (ulong)uVar1 + 0xf & 0xfffffffffffffff0;
  if (0 < M->n_col) {
    uVar4 = 0;
    do {
      if (__s[uVar4] == '\0') {
        if (uVar4 == (uint)colperm[uVar4]) {
          __s[uVar4] = '\x01';
        }
        else {
          if (0 < (int)uVar1) {
            sVar2 = M->rstride;
            puVar6 = M->e + uVar4;
            uVar8 = 0;
            do {
              __s[uVar8 - uVar3] = *puVar6;
              uVar8 = uVar8 + 1;
              puVar6 = puVar6 + sVar2;
            } while (uVar1 != uVar8);
          }
          iVar5 = (int)uVar4;
          if (uVar4 != (uint)colperm[uVar4]) {
            uVar8 = (ulong)(uint)colperm[uVar4];
            uVar9 = uVar4 & 0xffffffff;
            do {
              uVar7 = uVar8;
              iVar5 = (int)uVar7;
              __s[iVar5] = '\x01';
              if (0 < M->n_row) {
                lVar10 = 0;
                do {
                  lVar11 = M->rstride * lVar10;
                  M->e[(int)uVar9 + lVar11] = M->e[iVar5 + lVar11];
                  lVar10 = lVar10 + 1;
                } while (lVar10 < M->n_row);
              }
              uVar8 = (ulong)(uint)colperm[iVar5];
              uVar9 = uVar7;
            } while (uVar4 != (uint)colperm[iVar5]);
          }
          __s[uVar4] = '\x01';
          if (0 < M->n_row) {
            lVar10 = 0;
            do {
              M->e[(long)iVar5 + M->rstride * lVar10] = __s[lVar10 - uVar3];
              lVar10 = lVar10 + 1;
            } while (lVar10 < M->n_row);
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)M->n_col);
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_cols)(MV_GEN_TYPE* M, const int* colperm)
{
	char visited[M->n_col];
	for (int i = 0; i < M->n_col; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(colbuf_mat, colbuf, M->n_row, 1);
	for (int i = 0; i < M->n_col; ++i) {
		if (visited[i])
			continue;
		if (colperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_col)(M, i, &colbuf_mat, 0);
		int e = i, e_next = colperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_col)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = colperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_col)(&colbuf_mat, 0, M, e);
	}
}